

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerator.cpp
# Opt level: O0

void __thiscall SignalGenerator::SignalGenerator(SignalGenerator *this)

{
  SignalGenerator_param *this_00;
  Logging *this_01;
  duration __mean;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *this_02;
  Neuron *in_RDI;
  uint seed;
  result_type_conflict in_stack_ffffffffffffff78;
  Neuron *in_stack_ffffffffffffff80;
  Logging *local_50;
  _func_int **local_48;
  long local_40;
  undefined1 local_38;
  undefined8 local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  undefined4 local_18;
  
  Neuron::Neuron(in_RDI);
  in_RDI->_vptr_Neuron = (_func_int **)&PTR_update_00198b40;
  this_00 = (SignalGenerator_param *)operator_new(0x58);
  SignalGenerator_param::SignalGenerator_param(this_00);
  in_RDI[1].populationID = (long)this_00;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x16f3cf);
  std::normal_distribution<double>::normal_distribution((normal_distribution<double> *)0x16f3df);
  this_01 = (Logging *)Clock::getInstance();
  in_RDI[2].logger = this_01;
  Neuron::initialize(in_stack_ffffffffffffff80);
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  __mean = std::chrono::
           time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           ::time_since_epoch(&local_28);
  local_20.__r = __mean.__r;
  this_02 = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
            std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  local_18 = SUB84(this_02,0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(this_02,in_stack_ffffffffffffff78);
  *(undefined8 *)&in_RDI[1].neuronID = local_30;
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)this_01,(result_type)__mean.__r,(result_type)this_02);
  in_RDI[1].logger = local_50;
  in_RDI[2]._vptr_Neuron = local_48;
  in_RDI[2].populationID = local_40;
  *(undefined1 *)&in_RDI[2].neuronID = local_38;
  return;
}

Assistant:

SignalGenerator::SignalGenerator() : param(new SignalGenerator_param) {
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(0);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}